

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  bool bVar1;
  XmlFormatting fmt;
  int iVar2;
  ulong uVar3;
  XmlWriter *pXVar4;
  undefined4 extraout_var;
  Version *attribute;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type extraout_RDX;
  StringRef SVar5;
  int local_cc;
  StringRef local_c8;
  uint local_b4;
  StringRef local_b0;
  char *local_a0;
  StringRef local_90;
  allocator<char> local_79;
  string local_78;
  StringRef local_48;
  undefined1 local_38 [8];
  string stylesheetRef;
  TestRunInfo *testInfo_local;
  XmlReporter *this_local;
  
  stylesheetRef.field_2._8_8_ = testInfo;
  StreamingReporterBase::testRunStarting(&this->super_StreamingReporterBase,testInfo);
  (*(this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener
    [0x18])(local_38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    StringRef::StringRef(&local_48,(string *)local_38);
    XmlWriter::writeStylesheetRef(&this->m_xml,local_48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Catch2TestRun",&local_79);
  fmt = operator|(Newline,Indent);
  pXVar4 = XmlWriter::startElement(&this->m_xml,&local_78,fmt);
  local_90 = operator____sr("name",4);
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[3])();
  local_a0 = (char *)CONCAT44(extraout_var,iVar2);
  SVar5.m_size = extraout_RDX;
  SVar5.m_start = local_a0;
  pXVar4 = XmlWriter::writeAttribute(pXVar4,local_90,SVar5);
  local_b0 = operator____sr("rng-seed",8);
  local_b4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config
               )->_vptr_IConfig[0x11])();
  pXVar4 = XmlWriter::writeAttribute<unsigned_int,void>(pXVar4,local_b0,&local_b4);
  local_c8 = operator____sr("xml-format-version",0x12);
  local_cc = 3;
  pXVar4 = XmlWriter::writeAttribute<int,void>(pXVar4,local_c8,&local_cc);
  SVar5 = operator____sr("catch2-version",0xe);
  attribute = libraryVersion();
  XmlWriter::writeAttribute<Catch::Version,void>(pXVar4,SVar5,attribute);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var_00,iVar2));
  if (bVar1) {
    SVar5 = operator____sr("filters",7);
    iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    XmlWriter::writeAttribute<Catch::TestSpec,void>
              (&this->m_xml,SVar5,(TestSpec *)CONCAT44(extraout_var_01,iVar2));
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement("Catch2TestRun")
             .writeAttribute("name"_sr, m_config->name())
             .writeAttribute("rng-seed"_sr, m_config->rngSeed())
             .writeAttribute("xml-format-version"_sr, 3)
             .writeAttribute("catch2-version"_sr, libraryVersion());
        if ( m_config->testSpec().hasFilters() ) {
            m_xml.writeAttribute( "filters"_sr, m_config->testSpec() );
        }
    }